

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

long calc_score(int how)

{
  xchar xVar1;
  long lVar2;
  long lVar3;
  undefined4 local_28;
  long lStack_20;
  int deepest;
  long tmp;
  long umoney;
  int how_local;
  
  xVar1 = deepest_lev_reached('\0');
  local_28 = (int)xVar1;
  lVar2 = money_cnt(invent);
  lStack_20 = (long)u.umoney0;
  lVar3 = hidden_gold();
  lStack_20 = (lVar3 + lVar2) - lStack_20;
  if (lStack_20 < 0) {
    lStack_20 = 0;
  }
  if (how < 0xc) {
    lStack_20 = lStack_20 - lStack_20 / 10;
  }
  u.urscore = u.urscore + (int)lStack_20 + (local_28 + -1) * 0x32;
  if (0x14 < local_28) {
    if (local_28 < 0x1f) {
      local_28 = local_28 + -0x14;
    }
    else {
      local_28 = 10;
    }
    u.urscore = u.urscore + local_28 * 1000;
  }
  if ((how == 0x11) || (how == 0x10)) {
    u.urscore = u.urscore << 1;
  }
  return lVar3 + lVar2;
}

Assistant:

static long calc_score(int how)
{
	long umoney;
	long tmp;
	int deepest = deepest_lev_reached(FALSE);

	umoney = money_cnt(invent);
	tmp = u.umoney0;
	umoney += hidden_gold();	/* accumulate gold from containers */
	tmp = umoney - tmp;		/* net gain */

	if (tmp < 0L)
	    tmp = 0L;
	if (how < PANICKED)
	    tmp -= tmp / 10L;
	u.urscore += tmp;
	u.urscore += 50L * (long)(deepest - 1);
	if (deepest > 20)
	    u.urscore += 1000L * (long)((deepest > 30) ? 10 : deepest - 20);
	if (how == ASCENDED || how == DEFIED) u.urscore *= 2L;

	return umoney;
}